

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto_writer.cc
# Opt level: O1

Field * __thiscall
google::protobuf::util::converter::ProtoWriter::Lookup
          (ProtoWriter *this,StringPiece unnormalized_name)

{
  ProtoElement *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  _func_int **pp_Var4;
  long lVar5;
  char *pcVar6;
  LocationTrackerInterface *pLVar7;
  ErrorListener *pEVar8;
  char *pcVar9;
  undefined8 uVar10;
  Field *pFVar11;
  long lVar3;
  
  lVar5 = unnormalized_name.length_;
  pcVar6 = unnormalized_name.ptr_;
  iVar2 = (*(this->super_StructuredObjectWriter).super_ObjectWriter._vptr_ObjectWriter[0x11])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  if (lVar3 == 0) {
    pPVar1 = (this->element_)._M_t.
             super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
             ._M_t.
             super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
             .
             super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
             ._M_head_impl;
    pEVar8 = this->listener_;
    if (pPVar1 == (ProtoElement *)0x0) {
      pLVar7 = (this->tracker_)._M_t.
               super___uniq_ptr_impl<google::protobuf::util::converter::LocationTrackerInterface,_std::default_delete<google::protobuf::util::converter::LocationTrackerInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::util::converter::LocationTrackerInterface_*,_std::default_delete<google::protobuf::util::converter::LocationTrackerInterface>_>
               .
               super__Head_base<0UL,_google::protobuf::util::converter::LocationTrackerInterface_*,_false>
               ._M_head_impl;
    }
    else {
      pLVar7 = &pPVar1->super_LocationTrackerInterface;
    }
    pp_Var4 = pEVar8->_vptr_ErrorListener;
    pcVar9 = "Root element must be a message.";
    uVar10 = 0x1f;
LAB_0031e59d:
    (*pp_Var4[2])(pEVar8,pLVar7,pcVar6,lVar5,pcVar9,uVar10);
    pFVar11 = (Field *)0x0;
  }
  else {
    if (lVar5 != 0) {
      iVar2 = (*this->typeinfo_->_vptr_TypeInfo[5])
                        (this->typeinfo_,*(undefined8 *)(lVar3 + 0x40),pcVar6,lVar5);
      if ((Field *)CONCAT44(extraout_var_00,iVar2) != (Field *)0x0) {
        return (Field *)CONCAT44(extraout_var_00,iVar2);
      }
      if (this->ignore_unknown_fields_ != false) {
        return (Field *)0x0;
      }
      pPVar1 = (this->element_)._M_t.
               super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
               .
               super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
               ._M_head_impl;
      if (pPVar1 == (ProtoElement *)0x0) {
        pLVar7 = (this->tracker_)._M_t.
                 super___uniq_ptr_impl<google::protobuf::util::converter::LocationTrackerInterface,_std::default_delete<google::protobuf::util::converter::LocationTrackerInterface>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::util::converter::LocationTrackerInterface_*,_std::default_delete<google::protobuf::util::converter::LocationTrackerInterface>_>
                 .
                 super__Head_base<0UL,_google::protobuf::util::converter::LocationTrackerInterface_*,_false>
                 ._M_head_impl;
      }
      else {
        pLVar7 = &pPVar1->super_LocationTrackerInterface;
      }
      (*this->listener_->_vptr_ErrorListener[2])
                (this->listener_,pLVar7,pcVar6,lVar5,"Cannot find field.",0x12);
      return (Field *)0x0;
    }
    if (*(long *)(lVar3 + 0x28) == 0) {
      pPVar1 = (this->element_)._M_t.
               super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
               .
               super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
               ._M_head_impl;
      if (pPVar1 == (ProtoElement *)0x0) {
        pLVar7 = (this->tracker_)._M_t.
                 super___uniq_ptr_impl<google::protobuf::util::converter::LocationTrackerInterface,_std::default_delete<google::protobuf::util::converter::LocationTrackerInterface>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::util::converter::LocationTrackerInterface_*,_std::default_delete<google::protobuf::util::converter::LocationTrackerInterface>_>
                 .
                 super__Head_base<0UL,_google::protobuf::util::converter::LocationTrackerInterface_*,_false>
                 ._M_head_impl;
      }
      else {
        pLVar7 = &pPVar1->super_LocationTrackerInterface;
      }
      (*this->listener_->_vptr_ErrorListener[2])
                (this->listener_,pLVar7,pcVar6,0,"Proto fields must have a name.",0x1e);
    }
    else if (*(int *)(*(long *)(lVar3 + 0x28) + 0x4c) != 3) {
      pPVar1 = (this->element_)._M_t.
               super___uniq_ptr_impl<google::protobuf::util::converter::ProtoWriter::ProtoElement,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_std::default_delete<google::protobuf::util::converter::ProtoWriter::ProtoElement>_>
               .
               super__Head_base<0UL,_google::protobuf::util::converter::ProtoWriter::ProtoElement_*,_false>
               ._M_head_impl;
      pEVar8 = this->listener_;
      if (pPVar1 == (ProtoElement *)0x0) {
        pLVar7 = (this->tracker_)._M_t.
                 super___uniq_ptr_impl<google::protobuf::util::converter::LocationTrackerInterface,_std::default_delete<google::protobuf::util::converter::LocationTrackerInterface>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::util::converter::LocationTrackerInterface_*,_std::default_delete<google::protobuf::util::converter::LocationTrackerInterface>_>
                 .
                 super__Head_base<0UL,_google::protobuf::util::converter::LocationTrackerInterface_*,_false>
                 ._M_head_impl;
      }
      else {
        pLVar7 = &pPVar1->super_LocationTrackerInterface;
      }
      pp_Var4 = pEVar8->_vptr_ErrorListener;
      pcVar9 = "Proto fields must have a name.";
      uVar10 = 0x1e;
      goto LAB_0031e59d;
    }
    pFVar11 = *(Field **)(lVar3 + 0x28);
  }
  return pFVar11;
}

Assistant:

const google::protobuf::Field* ProtoWriter::Lookup(
    StringPiece unnormalized_name) {
  ProtoElement* e = element();
  if (e == nullptr) {
    InvalidName(unnormalized_name, "Root element must be a message.");
    return nullptr;
  }
  if (unnormalized_name.empty()) {
    // Objects in repeated field inherit the same field descriptor.
    if (e->parent_field() == nullptr) {
      InvalidName(unnormalized_name, "Proto fields must have a name.");
    } else if (!IsRepeated(*e->parent_field())) {
      InvalidName(unnormalized_name, "Proto fields must have a name.");
      return nullptr;
    }
    return e->parent_field();
  }
  const google::protobuf::Field* field =
      typeinfo_->FindField(&e->type(), unnormalized_name);
  if (field == nullptr && !ignore_unknown_fields_) {
    InvalidName(unnormalized_name, "Cannot find field.");
  }
  return field;
}